

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

string * __thiscall
pbrt::ParameterDictionary::ToParameterDefinition_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *p,
          int indentCount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParsedParameter **ppPVar2;
  RGBColorSpace *pRVar3;
  ParsedParameter *pPVar4;
  size_type sVar5;
  int iVar6;
  long *plVar7;
  size_type *psVar8;
  string *ret;
  int iVar9;
  char *pcVar10;
  ParsedParameter *pPVar11;
  long lVar12;
  ParsedParameter *pPVar13;
  bool bVar14;
  string local_98;
  double local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ParameterDictionary *local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,"\"%s %s\" [ ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->params).field_2 + 0x10));
  local_70 = (long)(this->params).ptr +
             (long)&((this->params).field_2.fixed[3]->type)._M_dataplus._M_p + (ulong)((int)p + 10);
  iVar9 = (int)p + 4 + (int)__return_storage_ptr__->_M_string_length;
  ppPVar2 = this[1].params.ptr;
  local_68 = paVar1;
  local_60 = this;
  if (ppPVar2 != (ParsedParameter **)0x0) {
    pRVar3 = this->colorSpace;
    local_58 = (long)(int)local_70;
    lVar12 = 0;
    do {
      local_78 = *(double *)
                  ((long)&(((RGBColorSpace *)(&pRVar3->XYZFromRGB + -2))->r).
                          super_Tuple2<pbrt::Point2,_float>.x + lVar12);
      iVar6 = std::__cxx11::string::compare((char *)local_60);
      if (iVar6 == 0) {
        local_50._M_dataplus._M_p._0_4_ = (float)(int)local_78;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity =
             (ulong)(uint7)local_98.field_2._M_allocated_capacity._1_7_ << 8;
        detail::stringPrintfRecursive<int>(&local_98,"%d ",(int *)&local_50);
        if (0x50 < iVar9) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                     (char)local_58);
          iVar9 = (int)local_70;
        }
        iVar6 = (int)local_98._M_string_length;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      }
      else {
        local_50._M_dataplus._M_p._0_4_ = (float)local_78;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity =
             (ulong)(uint7)local_98.field_2._M_allocated_capacity._1_7_ << 8;
        detail::stringPrintfRecursive<float>(&local_98,"%f ",(float *)&local_50);
        if (0x50 < iVar9) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                     (char)local_58);
          iVar9 = (int)local_70;
        }
        iVar6 = (int)local_98._M_string_length;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      iVar9 = iVar9 + iVar6;
      lVar12 = lVar12 + 8;
    } while ((long)ppPVar2 << 3 != lVar12);
  }
  pPVar4 = local_60[1].params.field_2.fixed[3];
  if (pPVar4 != (ParsedParameter *)0x0) {
    pPVar13 = local_60[1].params.field_2.fixed[1];
    local_78 = (double)(long)(int)local_70;
    lVar12 = (long)pPVar4 << 5;
    do {
      std::operator+(&local_50,'\"',&pPVar13->type);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (0x50 < iVar9) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                   SUB81(local_78,0));
        iVar9 = (int)local_70;
      }
      sVar5 = local_98._M_string_length;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      iVar9 = iVar9 + (int)sVar5;
      pPVar13 = (ParsedParameter *)&pPVar13->name;
      lVar12 = lVar12 + -0x20;
    } while (lVar12 != 0);
  }
  pPVar4 = local_60[1].params.field_2.fixed[7];
  if (pPVar4 != (ParsedParameter *)0x0) {
    pPVar13 = local_60[1].params.field_2.fixed[5];
    local_78 = (double)(long)(int)local_70;
    pPVar11 = (ParsedParameter *)0x0;
    do {
      bVar14 = *(char *)((long)&(pPVar11->type)._M_dataplus._M_p +
                        (long)&(pPVar13->type)._M_dataplus._M_p) == '\0';
      pcVar10 = "true ";
      if (bVar14) {
        pcVar10 = "false ";
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pcVar10,pcVar10 + (ulong)bVar14 + 5);
      if (0x50 < iVar9) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                   SUB81(local_78,0));
        iVar9 = (int)local_70;
      }
      sVar5 = local_98._M_string_length;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      iVar9 = iVar9 + (int)sVar5;
      pPVar11 = (ParsedParameter *)((long)&(pPVar11->type)._M_dataplus._M_p + 1);
    } while (pPVar4 != pPVar11);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterDefinition(const ParsedParameter *p,
                                                       int indentCount) {
    std::string s = StringPrintf("\"%s %s\" [ ", p->type, p->name);
    int continuationIndent = indentCount + 10 + p->type.size() + p->name.size();
    int column = indentCount + 4 + s.size();
    auto printOne = [&](const std::string &val) {
        if (column > 80) {  //   && i % 3 == 0) {
            s += "\n";
            s.append(continuationIndent, ' ');
            column = continuationIndent;
        }
        column += val.size();
        s += val;
    };

    for (double v : p->numbers)
        if (p->type == ParameterTypeTraits<ParameterType::Integer>::typeName)
            printOne(StringPrintf("%d ", int(v)));
        else
            printOne(StringPrintf("%f ", Float(v)));
    for (const auto &str : p->strings)
        printOne('"' + str + "\" ");
    for (bool b : p->bools)
        printOne(b ? "true " : "false ");
    s += "]";

    return s;
}